

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigUtil.c
# Opt level: O2

Fraig_Node_t *
Fraig_NodeRecognizeMux(Fraig_Node_t *pNode,Fraig_Node_t **ppNodeT,Fraig_Node_t **ppNodeE)

{
  ulong *puVar1;
  Fraig_Node_t *pFVar2;
  int iVar3;
  ulong *puVar4;
  ulong uVar5;
  ulong *puVar6;
  ulong uVar7;
  ulong *puVar8;
  Fraig_Node_t *pFVar9;
  Fraig_Node_t *pFVar10;
  
  if (((ulong)pNode & 1) != 0) {
    __assert_fail("!Fraig_IsComplement(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fraig/fraigUtil.c"
                  ,0x295,
                  "Fraig_Node_t *Fraig_NodeRecognizeMux(Fraig_Node_t *, Fraig_Node_t **, Fraig_Node_t **)"
                 );
  }
  iVar3 = Fraig_NodeIsMuxType(pNode);
  if (iVar3 != 0) {
    uVar5 = (ulong)pNode->p1 & 0xfffffffffffffffe;
    uVar7 = (ulong)pNode->p2 & 0xfffffffffffffffe;
    puVar6 = (ulong *)(uVar5 + 0x20);
    pFVar2 = *(Fraig_Node_t **)(uVar5 + 0x20);
    puVar1 = (ulong *)(uVar7 + 0x20);
    pFVar9 = (Fraig_Node_t *)(*(ulong *)(uVar7 + 0x20) ^ 1);
    puVar4 = puVar6;
    if (pFVar2 == pFVar9) {
      if (((ulong)pFVar2 & 1) == 0) {
        *ppNodeT = (Fraig_Node_t *)(*(ulong *)(uVar5 + 0x28) ^ 1);
        puVar6 = (ulong *)(uVar7 + 0x28);
      }
      else {
        *ppNodeT = (Fraig_Node_t *)(*(ulong *)(uVar7 + 0x28) ^ 1);
        puVar4 = puVar1;
        puVar6 = (ulong *)(uVar5 + 0x28);
      }
    }
    else {
      puVar8 = (ulong *)(uVar7 + 0x28);
      pFVar10 = (Fraig_Node_t *)(*(ulong *)(uVar7 + 0x28) ^ 1);
      if (pFVar2 == pFVar10) {
        if (((ulong)pFVar2 & 1) == 0) {
          *ppNodeT = (Fraig_Node_t *)(*(ulong *)(uVar5 + 0x28) ^ 1);
          puVar6 = puVar1;
        }
        else {
          *ppNodeT = pFVar9;
          puVar6 = (ulong *)(uVar5 + 0x28);
          puVar4 = puVar8;
        }
      }
      else {
        puVar4 = (ulong *)(uVar5 + 0x28);
        if (*(Fraig_Node_t **)(uVar5 + 0x28) == pFVar9) {
          if ((*(ulong *)(uVar7 + 0x20) & 1) == 0) {
            *ppNodeT = pFVar10;
            puVar4 = puVar1;
          }
          else {
            *ppNodeT = (Fraig_Node_t *)((ulong)pFVar2 ^ 1);
            puVar6 = puVar8;
          }
        }
        else {
          if (*(Fraig_Node_t **)(uVar5 + 0x28) != pFVar10) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fraig/fraigUtil.c"
                          ,0x2d7,
                          "Fraig_Node_t *Fraig_NodeRecognizeMux(Fraig_Node_t *, Fraig_Node_t **, Fraig_Node_t **)"
                         );
          }
          if ((*(ulong *)(uVar7 + 0x28) & 1) == 0) {
            *ppNodeT = pFVar9;
            puVar4 = puVar8;
          }
          else {
            *ppNodeT = (Fraig_Node_t *)((ulong)pFVar2 ^ 1);
            puVar6 = puVar1;
          }
        }
      }
    }
    *ppNodeE = (Fraig_Node_t *)(*puVar6 ^ 1);
    return (Fraig_Node_t *)*puVar4;
  }
  __assert_fail("Fraig_NodeIsMuxType(pNode)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fraig/fraigUtil.c"
                ,0x296,
                "Fraig_Node_t *Fraig_NodeRecognizeMux(Fraig_Node_t *, Fraig_Node_t **, Fraig_Node_t **)"
               );
}

Assistant:

Fraig_Node_t * Fraig_NodeRecognizeMux( Fraig_Node_t * pNode, Fraig_Node_t ** ppNodeT, Fraig_Node_t ** ppNodeE )
{
    Fraig_Node_t * pNode1, * pNode2;
    assert( !Fraig_IsComplement(pNode) );
    assert( Fraig_NodeIsMuxType(pNode) );
    // get children
    pNode1 = Fraig_Regular(pNode->p1);
    pNode2 = Fraig_Regular(pNode->p2);
    // find the control variable
    if ( pNode1->p1 == Fraig_Not(pNode2->p1) )
    {
        if ( Fraig_IsComplement(pNode1->p1) )
        { // pNode2->p1 is positive phase of C
            *ppNodeT = Fraig_Not(pNode2->p2);
            *ppNodeE = Fraig_Not(pNode1->p2);
            return pNode2->p1;
        }
        else
        { // pNode1->p1 is positive phase of C
            *ppNodeT = Fraig_Not(pNode1->p2);
            *ppNodeE = Fraig_Not(pNode2->p2);
            return pNode1->p1;
        }
    }
    else if ( pNode1->p1 == Fraig_Not(pNode2->p2) )
    {
        if ( Fraig_IsComplement(pNode1->p1) )
        { // pNode2->p2 is positive phase of C
            *ppNodeT = Fraig_Not(pNode2->p1);
            *ppNodeE = Fraig_Not(pNode1->p2);
            return pNode2->p2;
        }
        else
        { // pNode1->p1 is positive phase of C
            *ppNodeT = Fraig_Not(pNode1->p2);
            *ppNodeE = Fraig_Not(pNode2->p1);
            return pNode1->p1;
        }
    }
    else if ( pNode1->p2 == Fraig_Not(pNode2->p1) )
    {
        if ( Fraig_IsComplement(pNode1->p2) )
        { // pNode2->p1 is positive phase of C
            *ppNodeT = Fraig_Not(pNode2->p2);
            *ppNodeE = Fraig_Not(pNode1->p1);
            return pNode2->p1;
        }
        else
        { // pNode1->p2 is positive phase of C
            *ppNodeT = Fraig_Not(pNode1->p1);
            *ppNodeE = Fraig_Not(pNode2->p2);
            return pNode1->p2;
        }
    }
    else if ( pNode1->p2 == Fraig_Not(pNode2->p2) )
    {
        if ( Fraig_IsComplement(pNode1->p2) )
        { // pNode2->p2 is positive phase of C
            *ppNodeT = Fraig_Not(pNode2->p1);
            *ppNodeE = Fraig_Not(pNode1->p1);
            return pNode2->p2;
        }
        else
        { // pNode1->p2 is positive phase of C
            *ppNodeT = Fraig_Not(pNode1->p1);
            *ppNodeE = Fraig_Not(pNode2->p1);
            return pNode1->p2;
        }
    }
    assert( 0 ); // this is not MUX
    return NULL;
}